

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O2

void __thiscall duckdb::Node::ReplaceChild(Node *this,ART *art,uint8_t byte,Node child)

{
  Node ptr;
  BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3> *n;
  Node48 *pNVar1;
  Node256 *pNVar2;
  BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4> *n_00;
  InternalException *this_00;
  IndexPointer IVar3;
  allocator local_59;
  string local_58;
  string local_38;
  
  ptr = (Node)(this->super_IndexPointer).data;
  switch(ptr.super_IndexPointer.data._7_1_ & 0x7f) {
  case NODE_4:
    n = &Ref<duckdb::Node4>(art,ptr,NODE_4)->super_BaseNode<(unsigned_char)__x04_,_(duckdb::NType)3>
    ;
    BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::ReplaceChild(n,byte,child);
    return;
  case NODE_16:
    n_00 = &Ref<duckdb::Node16>(art,ptr,NODE_16)->
            super_BaseNode<(unsigned_char)__x10_,_(duckdb::NType)4>;
    BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::ReplaceChild(n_00,byte,child);
    return;
  case NODE_48:
    pNVar1 = Ref<duckdb::Node48>(art,ptr,NODE_48);
    IVar3.data = (ulong)child.super_IndexPointer.data | 0x8000000000000000;
    if ((ulong)child.super_IndexPointer.data >> 0x38 == 0) {
      IVar3 = child.super_IndexPointer.data;
    }
    if (-1 < (long)pNVar1->children[pNVar1->child_index[byte]].super_IndexPointer.data) {
      IVar3 = child.super_IndexPointer.data;
    }
    pNVar1->children[pNVar1->child_index[byte]].super_IndexPointer.data = IVar3.data;
    break;
  case NODE_256:
    pNVar2 = Ref<duckdb::Node256>(art,ptr,NODE_256);
    IVar3.data = (ulong)child.super_IndexPointer.data | 0x8000000000000000;
    if ((ulong)child.super_IndexPointer.data >> 0x38 == 0) {
      IVar3 = child.super_IndexPointer.data;
    }
    if (-1 < (long)pNVar2->children[byte].super_IndexPointer.data) {
      IVar3 = child.super_IndexPointer.data;
    }
    pNVar2->children[byte].super_IndexPointer.data = IVar3.data;
    break;
  default:
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_38,"Invalid node type for ReplaceChild: %s.",&local_59);
    EnumUtil::ToString<duckdb::NType>(&local_58,ptr.super_IndexPointer.data._7_1_ & 0x7f);
    InternalException::InternalException<std::__cxx11::string>(this_00,&local_38,&local_58);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void Node::ReplaceChild(const ART &art, const uint8_t byte, const Node child) const {
	D_ASSERT(HasMetadata());

	auto type = GetType();
	switch (type) {
	case NType::NODE_4:
		return Node4::ReplaceChild(Ref<Node4>(art, *this, type), byte, child);
	case NType::NODE_16:
		return Node16::ReplaceChild(Ref<Node16>(art, *this, type), byte, child);
	case NType::NODE_48:
		return Ref<Node48>(art, *this, type).ReplaceChild(byte, child);
	case NType::NODE_256:
		return Ref<Node256>(art, *this, type).ReplaceChild(byte, child);
	default:
		throw InternalException("Invalid node type for ReplaceChild: %s.", EnumUtil::ToString(type));
	}
}